

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

bool duckdb::TemplatedLikeOperator<(char)37,(char)95,true,duckdb::StandardCharacterReader>
               (char *sdata,idx_t slen,char *pdata,idx_t plen,char escape)

{
  ulong uVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  idx_t iVar5;
  idx_t iVar6;
  SyntaxException *this;
  bool bVar7;
  idx_t iVar8;
  allocator local_59;
  idx_t sidx;
  string local_50;
  
  sidx = 0;
  iVar8 = 0;
  do {
    if ((plen <= iVar8) || (slen <= sidx)) {
      iVar5 = plen;
      if (plen < iVar8) {
        iVar5 = iVar8;
      }
      for (; (iVar6 = iVar5, iVar8 < plen && (iVar6 = iVar8, pdata[iVar8] == '%'));
          iVar8 = iVar8 + 1) {
      }
      return sidx == slen && iVar6 == plen;
    }
    cVar2 = pdata[iVar8];
    if (cVar2 == escape) {
      iVar8 = iVar8 + 1;
      if (iVar8 == plen) {
        this = (SyntaxException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"Like pattern must not end with escape character!",&local_59)
        ;
        SyntaxException::SyntaxException(this,&local_50);
        __cxa_throw(this,&SyntaxException::typeinfo,::std::runtime_error::~runtime_error);
      }
      cVar2 = pdata[iVar8];
joined_r0x0153d5ba:
      if (cVar2 != sdata[sidx]) {
        return false;
      }
      sidx = sidx + 1;
    }
    else {
      if (cVar2 != '_') {
        if (cVar2 == '%') {
          do {
            uVar1 = iVar8 + 1;
            bVar7 = true;
            if (plen <= uVar1) {
              return true;
            }
            lVar3 = iVar8 + 1;
            iVar8 = uVar1;
          } while (pdata[lVar3] == '%');
          if (plen - uVar1 != 0) {
            while( true ) {
              iVar8 = slen - sidx;
              bVar7 = slen >= sidx && iVar8 != 0;
              if ((slen < sidx || iVar8 == 0) ||
                 (bVar4 = TemplatedLikeOperator<(char)37,(char)95,true,duckdb::StandardCharacterReader>
                                    (sdata + sidx,iVar8,pdata + uVar1,plen - uVar1,escape), bVar4))
              break;
              sidx = sidx + 1;
            }
          }
          return bVar7;
        }
        goto joined_r0x0153d5ba;
      }
      StandardCharacterReader::NextCharacter(sdata,slen,&sidx);
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

bool TemplatedLikeOperator(const char *sdata, idx_t slen, const char *pdata, idx_t plen, char escape) {
	idx_t pidx = 0;
	idx_t sidx = 0;
	for (; pidx < plen && sidx < slen; pidx++) {
		char pchar = READER::Operation(pdata, pidx);
		char schar = READER::Operation(sdata, sidx);
		if (HAS_ESCAPE && pchar == escape) {
			pidx++;
			if (pidx == plen) {
				throw SyntaxException("Like pattern must not end with escape character!");
			}
			if (pdata[pidx] != schar) {
				return false;
			}
			sidx++;
		} else if (pchar == UNDERSCORE) {
			READER::NextCharacter(sdata, slen, sidx);
		} else if (pchar == PERCENTAGE) {
			pidx++;
			while (pidx < plen && pdata[pidx] == PERCENTAGE) {
				pidx++;
			}
			if (pidx == plen) {
				return true; /* tail is acceptable */
			}
			for (; sidx < slen; sidx++) {
				if (TemplatedLikeOperator<PERCENTAGE, UNDERSCORE, HAS_ESCAPE, READER>(
				        sdata + sidx, slen - sidx, pdata + pidx, plen - pidx, escape)) {
					return true;
				}
			}
			return false;
		} else if (pchar == schar) {
			sidx++;
		} else {
			return false;
		}
	}
	while (pidx < plen && pdata[pidx] == PERCENTAGE) {
		pidx++;
	}
	return pidx == plen && sidx == slen;
}